

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O2

LLVMPointer __thiscall dg::DGLLVMPointsToSet::getKnownSingleton(DGLLVMPointsToSet *this)

{
  Pointer PVar1;
  LLVMPointer LVar2;
  const_iterator local_20;
  
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin(&local_20,
          &((this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).PTSet)
           ->pointers);
  PVar1 = pta::PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&local_20);
  LVar2.offset = PVar1.offset.offset;
  LVar2.value = *(Value **)(PVar1.target + 0x18);
  return LVar2;
}

Assistant:

LLVMPointer getKnownSingleton() const override {
        assert(isKnownSingleton());
        auto ptr = (*(PTSet.begin()));
        return {ptr.target->getUserData<llvm::Value>(), ptr.offset};
    }